

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

bool __thiscall license::EventRegistry::turnWarningsIntoErrors(EventRegistry *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference ppVar4;
  pointer paVar5;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_50;
  __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_> local_48;
  iterator it;
  AuditEvent *currentLog;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *mostAdvLogIter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range2;
  bool eventFound;
  EventRegistry *this_local;
  
  bVar1 = false;
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::size(&this->mostAdvancedLogIdx_by_LicenseId);
  if (sVar3 != 0) {
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::begin(&this->mostAdvancedLogIdx_by_LicenseId);
    mostAdvLogIter =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::end(&this->mostAdvancedLogIdx_by_LicenseId);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&mostAdvLogIter), bVar2) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
               ::operator*(&__end2);
      it._M_current =
           std::vector<AuditEvent,_std::allocator<AuditEvent>_>::operator[]
                     (&this->logs,ppVar4->second);
      if (((it._M_current)->severity == SVRT_WARN) || ((it._M_current)->severity == SVRT_ERROR)) {
        (it._M_current)->severity = SVRT_ERROR;
        bVar1 = true;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::operator++(&__end2);
    }
  }
  if (bVar1 == false) {
    local_48._M_current =
         (anon_struct_1288_4_4db92441_conflict *)
         std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&this->logs);
    while( true ) {
      local_50._M_current =
           (anon_struct_1288_4_4db92441_conflict *)
           std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
      bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar2) break;
      paVar5 = __gnu_cxx::
               __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
               ::operator->(&local_48);
      if (paVar5->severity == SVRT_WARN) {
        paVar5 = __gnu_cxx::
                 __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
                 ::operator->(&local_48);
        paVar5->severity = SVRT_ERROR;
        bVar1 = true;
      }
      __gnu_cxx::
      __normal_iterator<AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>::
      operator++(&local_48);
    }
  }
  return bVar1;
}

Assistant:

bool EventRegistry::turnWarningsIntoErrors() {
	bool eventFound = false;
	if (mostAdvancedLogIdx_by_LicenseId.size() > 0) {
		for (const auto &mostAdvLogIter : mostAdvancedLogIdx_by_LicenseId) {
			AuditEvent &currentLog = logs[mostAdvLogIter.second];
			if (currentLog.severity == SVRT_WARN || currentLog.severity == SVRT_ERROR) {
				currentLog.severity = SVRT_ERROR;
				eventFound = true;
			}
		}
	}
	if (!eventFound) {
		for (auto it = logs.begin(); it != logs.end(); ++it) {
			if (it->severity == SVRT_WARN) {
				it->severity = SVRT_ERROR;
				eventFound = true;
			}
		}
	}
	return eventFound;
}